

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::IsContinuationOfLowWorkHeadersSync
          (PeerManagerImpl *this,Peer *peer,CNode *pfrom,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers)

{
  unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *this_00;
  _Rb_tree_header *p_Var1;
  HeadersSyncState *pHVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  bool bVar6;
  common_comparison_category_t<__detail::__synth3way_t<arith_uint256>,___detail::__synth3way_t<optional<pair<long,_unsigned_int>_>_>_>
  cVar7;
  Logger *this_01;
  mapped_type *this_02;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  long lVar10;
  unique_lock<std::mutex> *this_03;
  pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *__y;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
  pVar11;
  NodeId local_b8;
  CBlockLocator locator;
  ProcessingResult local_98;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock62;
  undefined1 local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar2 = (peer->m_headers_sync)._M_t.
           super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
           super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
           super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl;
  if (pHVar2 == (HeadersSyncState *)0x0) {
    local_98.success = false;
    goto LAB_001eabd5;
  }
  HeadersSyncState::ProcessNextHeaders
            (&local_98,pHVar2,headers,
             (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                   _M_impl.super__Vector_impl_data._M_start == 160000);
  if (local_98.success == true) {
    (peer->m_last_getheaders_timestamp).__d.__r = 0;
  }
  this_00 = &peer->m_headers_sync;
  if (local_98.request_more == true) {
    HeadersSyncState::NextHeadersRequestLocator
              (&locator,(this_00->_M_t).
                        super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>
                        .super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl);
    if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)CONCAT71(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_finish._1_7_,
                          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_finish._0_1_)) {
      MaybeSendGetHeaders(this,pfrom,&locator,peer);
      this_01 = LogInstance();
      bVar6 = BCLog::Logger::WillLogCategoryLevel(this_01,NET,Debug);
      if (bVar6) {
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)&criticalblock62,
                   locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start);
        local_b8 = pfrom->id;
        logging_function._M_str = "IsContinuationOfLowWorkHeadersSync";
        logging_function._M_len = 0x22;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x5b;
        LogPrintf_<std::__cxx11::string,long>
                  (logging_function,source_file,0xaf4,NET,Debug,
                   "more getheaders (from %s) to peer=%d\n",(string *)&criticalblock62,&local_b8);
        if (criticalblock62.super_unique_lock._M_device != (mutex_type *)local_68) {
          operator_delete(criticalblock62.super_unique_lock._M_device,local_68._0_8_ + 1);
        }
      }
    }
    if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  pHVar2 = (this_00->_M_t).
           super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
           super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
           super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl;
  if (pHVar2->m_download_state == FINAL) {
    std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
              ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)this_00,
               (pointer)0x0);
    criticalblock62.super_unique_lock._M_device = &(this->m_headers_presync_mutex).super_mutex;
    criticalblock62.super_unique_lock._8_8_ =
         criticalblock62.super_unique_lock._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock(&criticalblock62.super_unique_lock);
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pfrom->id;
    pVar11 = std::
             _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
             ::equal_range(&(this->m_headers_presync_stats)._M_t,(key_type_conflict *)&locator);
    std::
    _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
    ::_M_erase_aux(&(this->m_headers_presync_stats)._M_t,(_Base_ptr)pVar11.first._M_node,
                   (_Base_ptr)pVar11.second._M_node);
    this_03 = &criticalblock62.super_unique_lock;
  }
  else {
    criticalblock62.super_unique_lock._M_device =
         *(mutex_type **)(pHVar2->m_current_chain_work).super_base_uint<256U>.pn;
    criticalblock62.super_unique_lock._8_8_ =
         *(undefined8 *)((long)&(pHVar2->m_current_chain_work).super_base_uint<256U> + 8);
    local_68._0_8_ =
         *(undefined8 *)((long)&(pHVar2->m_current_chain_work).super_base_uint<256U> + 0x10);
    local_68._8_8_ =
         *(undefined8 *)((long)&(pHVar2->m_current_chain_work).super_base_uint<256U> + 0x18);
    local_68[0x20] = pHVar2->m_download_state == PRESYNC;
    if ((bool)local_68[0x20]) {
      local_68._16_8_ = pHVar2->m_current_height;
      local_68._24_4_ = (pHVar2->m_last_header_received).nTime;
    }
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&this->m_headers_presync_mutex;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&locator);
    local_b8 = pfrom->id;
    this_02 = std::
              map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
              ::operator[](&this->m_headers_presync_stats,&local_b8);
    std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>::operator=
              (this_02,(type)&criticalblock62);
    p_Var9 = (this->m_headers_presync_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(this->m_headers_presync_stats)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    if (p_Var9 != (_Base_ptr)0x0) {
      do {
        if (this->m_headers_presync_bestpeer <= *(long *)(p_Var9 + 1)) {
          p_Var8 = p_Var9;
        }
        p_Var9 = (&p_Var9->_M_left)[*(long *)(p_Var9 + 1) < this->m_headers_presync_bestpeer];
      } while (p_Var9 != (_Base_ptr)0x0);
    }
    p_Var9 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
       (p_Var9 = p_Var8, this->m_headers_presync_bestpeer < *(long *)(p_Var8 + 1))) {
      p_Var9 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var9 == p_Var1) {
      p_Var9 = (this->m_headers_presync_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      lVar10 = -1;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        __y = (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)0x0;
        do {
          if ((__y == (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)0x0) ||
             (cVar7 = std::operator<=><arith_uint256,std::optional<std::pair<long,unsigned_int>>>
                                ((pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>
                                  *)&p_Var9[1]._M_parent,__y), '\0' < cVar7._M_value)) {
            lVar10 = *(long *)(p_Var9 + 1);
            __y = (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
                  &p_Var9[1]._M_parent;
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
      this->m_headers_presync_bestpeer = lVar10;
      if (lVar10 == pfrom->id) goto LAB_001eab74;
    }
    else if ((*(long *)(p_Var9 + 1) == pfrom->id) ||
            (cVar7 = std::operator<=><arith_uint256,std::optional<std::pair<long,unsigned_int>>>
                               ((pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>
                                 *)&criticalblock62,
                                (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>
                                 *)&p_Var9[1]._M_parent), '\0' < cVar7._M_value)) {
      this->m_headers_presync_bestpeer = pfrom->id;
LAB_001eab74:
      if (local_68[0x20] == '\x01') {
        LOCK();
        (this->m_headers_presync_should_signal)._M_base._M_i = true;
        UNLOCK();
      }
    }
    this_03 = (unique_lock<std::mutex> *)&locator;
  }
  std::unique_lock<std::mutex>::~unique_lock(this_03);
  if (local_98.success == true) {
    pCVar3 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_98.pow_validated_headers.
         super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pCVar4 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pCVar5 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_98.pow_validated_headers.
         super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
         super__Vector_impl_data._M_start;
    (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.pow_validated_headers.
         super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_98.pow_validated_headers.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
    _M_impl.super__Vector_impl_data._M_start = pCVar4;
    local_98.pow_validated_headers.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
    _M_impl.super__Vector_impl_data._M_finish = pCVar5;
    local_98.pow_validated_headers.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pCVar3;
  }
  if (local_98.pow_validated_headers.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.pow_validated_headers.
                    super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.pow_validated_headers.
                          super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.pow_validated_headers.
                          super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_001eabd5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_98.success;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::IsContinuationOfLowWorkHeadersSync(Peer& peer, CNode& pfrom, std::vector<CBlockHeader>& headers)
{
    if (peer.m_headers_sync) {
        auto result = peer.m_headers_sync->ProcessNextHeaders(headers, headers.size() == MAX_HEADERS_RESULTS);
        // If it is a valid continuation, we should treat the existing getheaders request as responded to.
        if (result.success) peer.m_last_getheaders_timestamp = {};
        if (result.request_more) {
            auto locator = peer.m_headers_sync->NextHeadersRequestLocator();
            // If we were instructed to ask for a locator, it should not be empty.
            Assume(!locator.vHave.empty());
            // We can only be instructed to request more if processing was successful.
            Assume(result.success);
            if (!locator.vHave.empty()) {
                // It should be impossible for the getheaders request to fail,
                // because we just cleared the last getheaders timestamp.
                bool sent_getheaders = MaybeSendGetHeaders(pfrom, locator, peer);
                Assume(sent_getheaders);
                LogDebug(BCLog::NET, "more getheaders (from %s) to peer=%d\n",
                    locator.vHave.front().ToString(), pfrom.GetId());
            }
        }

        if (peer.m_headers_sync->GetState() == HeadersSyncState::State::FINAL) {
            peer.m_headers_sync.reset(nullptr);

            // Delete this peer's entry in m_headers_presync_stats.
            // If this is m_headers_presync_bestpeer, it will be replaced later
            // by the next peer that triggers the else{} branch below.
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats.erase(pfrom.GetId());
        } else {
            // Build statistics for this peer's sync.
            HeadersPresyncStats stats;
            stats.first = peer.m_headers_sync->GetPresyncWork();
            if (peer.m_headers_sync->GetState() == HeadersSyncState::State::PRESYNC) {
                stats.second = {peer.m_headers_sync->GetPresyncHeight(),
                                peer.m_headers_sync->GetPresyncTime()};
            }

            // Update statistics in stats.
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats[pfrom.GetId()] = stats;
            auto best_it = m_headers_presync_stats.find(m_headers_presync_bestpeer);
            bool best_updated = false;
            if (best_it == m_headers_presync_stats.end()) {
                // If the cached best peer is outdated, iterate over all remaining ones (including
                // newly updated one) to find the best one.
                NodeId peer_best{-1};
                const HeadersPresyncStats* stat_best{nullptr};
                for (const auto& [peer, stat] : m_headers_presync_stats) {
                    if (!stat_best || stat > *stat_best) {
                        peer_best = peer;
                        stat_best = &stat;
                    }
                }
                m_headers_presync_bestpeer = peer_best;
                best_updated = (peer_best == pfrom.GetId());
            } else if (best_it->first == pfrom.GetId() || stats > best_it->second) {
                // pfrom was and remains the best peer, or pfrom just became best.
                m_headers_presync_bestpeer = pfrom.GetId();
                best_updated = true;
            }
            if (best_updated && stats.second.has_value()) {
                // If the best peer updated, and it is in its first phase, signal.
                m_headers_presync_should_signal = true;
            }
        }

        if (result.success) {
            // We only overwrite the headers passed in if processing was
            // successful.
            headers.swap(result.pow_validated_headers);
        }

        return result.success;
    }
    // Either we didn't have a sync in progress, or something went wrong
    // processing these headers, or we are returning headers to the caller to
    // process.
    return false;
}